

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *s)

{
  BottomFirstIterator it;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  size_t sVar2;
  
  sVar2 = s->_capacity;
  this->_capacity = sVar2;
  if (sVar2 == 0) {
    sVar2 = 0;
    pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  }
  else {
    pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             Lib::alloc(sVar2 * 0x1c);
    sVar2 = this->_capacity;
  }
  this->_stack = pMVar1;
  this->_cursor = pMVar1;
  this->_end = pMVar1 + sVar2;
  it._pointer = s->_stack;
  it._afterLast = s->_cursor;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>::
  loadFromIterator<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>::BottomFirstIterator>
            ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>> *)this,it)
  ;
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }